

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::CopyToFunctionLocalState::InitializeAppendState
          (CopyToFunctionLocalState *this,ClientContext *context,PhysicalCopyToFile *op,
          CopyToFunctionGlobalState *gstate)

{
  _Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::PartitionedColumnDataAppendState_*,_false> _Var2;
  PartitionedColumnDataAppendState *in_RAX;
  pointer this_00;
  type state;
  _Head_base<0UL,_duckdb::PartitionedColumnDataAppendState_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  make_uniq<duckdb::HivePartitionedColumnData,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<unsigned_long,true>const&,duckdb::shared_ptr<duckdb::GlobalHivePartitionState,true>&>
            ((duckdb *)&local_28,context,&op->expected_types,&op->partition_columns,
             &gstate->partition_state);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (pointer)0x0;
  _Var1._M_head_impl =
       (this->part_buffer).
       super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl;
  (this->part_buffer).
  super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl =
       (HivePartitionedColumnData *)_Var2._M_head_impl;
  if (_Var1._M_head_impl != (HivePartitionedColumnData *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_PartitionedColumnData + 8))();
    if (local_28._M_head_impl != (pointer)0x0) {
      (**(code **)(*(long *)&(local_28._M_head_impl)->partition_indices + 8))();
    }
  }
  make_uniq<duckdb::PartitionedColumnDataAppendState>();
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (PartitionedColumnDataAppendState *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  ::reset((__uniq_ptr_impl<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
           *)&this->part_buffer_append_state,_Var2._M_head_impl);
  ::std::
  unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  ::~unique_ptr((unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
                 *)&local_28);
  this_00 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
            ::operator->(&this->part_buffer);
  state = unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>
          ::operator*(&this->part_buffer_append_state);
  PartitionedColumnData::InitializeAppendState(&this_00->super_PartitionedColumnData,state);
  this->append_count = 0;
  return;
}

Assistant:

void InitializeAppendState(ClientContext &context, const PhysicalCopyToFile &op,
	                           CopyToFunctionGlobalState &gstate) {
		part_buffer = make_uniq<HivePartitionedColumnData>(context, op.expected_types, op.partition_columns,
		                                                   gstate.partition_state);
		part_buffer_append_state = make_uniq<PartitionedColumnDataAppendState>();
		part_buffer->InitializeAppendState(*part_buffer_append_state);
		append_count = 0;
	}